

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O1

void __thiscall
Sms_Apu::osc_output(Sms_Apu *this,int index,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right
                   )

{
  Sms_Osc *pSVar1;
  
  pSVar1 = this->oscs[index];
  pSVar1->outputs[1] = right;
  pSVar1->outputs[2] = left;
  pSVar1->outputs[3] = center;
  pSVar1->output = pSVar1->outputs[pSVar1->output_select];
  return;
}

Assistant:

void Sms_Apu::osc_output( int index, Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	require( (unsigned) index < osc_count );
	require( (center && left && right) || (!center && !left && !right) );
	Sms_Osc& osc = *oscs [index];
	osc.outputs [1] = right;
	osc.outputs [2] = left;
	osc.outputs [3] = center;
	osc.output = osc.outputs [osc.output_select];
}